

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void integer_suite::test_minus_one(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  int value;
  oarchive ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  long local_a8;
  undefined4 local_a0;
  int local_9c;
  oarchive local_98;
  
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_98,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
  local_9c = -1;
  boost::archive::save_access::save_primitive<trial::protocol::bintoken::oarchive,int>
            (&local_98,&local_9c);
  local_a8 = (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8._M_impl.super__Vector_impl_data._M_start;
  local_a0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_suite.cpp"
             ,0x84,"void integer_suite::test_minus_one()",&local_a8,&local_a0);
  local_a8 = CONCAT44(local_a8._4_4_,0xff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[0]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_suite.cpp"
             ,0x85,"void integer_suite::test_minus_one()",
             local_c8._M_impl.super__Vector_impl_data._M_start,&local_a8);
  trial::protocol::bintoken::oarchive::~oarchive(&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    int value = 0;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
}